

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O2

void print_category(uint category,uint cols)

{
  char *pcVar1;
  char *__s;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = 0;
  uVar5 = 5;
  uVar6 = uVar5;
  while( true ) {
    if (helptext[uVar4].opt == (char *)0x0) break;
    if ((helptext[uVar4].categories & category) != 0) {
      sVar3 = strlen(helptext[uVar4].opt);
      if (uVar6 < sVar3) {
        uVar6 = sVar3;
      }
      sVar3 = strlen(helptext[uVar4].desc);
      if (uVar5 < sVar3) {
        uVar5 = sVar3;
      }
    }
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  uVar4 = cols - uVar5;
  if (uVar5 + uVar6 <= (ulong)cols) {
    uVar4 = uVar6;
  }
  uVar5 = 0;
  while( true ) {
    pcVar1 = helptext[uVar5].opt;
    if (pcVar1 == (char *)0x0) break;
    if ((helptext[uVar5].categories & category) != 0) {
      __s = helptext[uVar5].desc;
      sVar3 = strlen(__s);
      uVar2 = (cols - 3) - (int)sVar3;
      if (cols - 2 <= sVar3) {
        uVar2 = 0;
      }
      uVar6 = uVar4 & 0xffffffff;
      if ((ulong)(cols - 2) <= sVar3 + uVar4) {
        uVar6 = (ulong)uVar2;
      }
      curl_mprintf(" %-*s  %s\n",uVar6,pcVar1,__s);
    }
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  return;
}

Assistant:

static void print_category(unsigned int category, unsigned int cols)
{
  unsigned int i;
  size_t longopt = 5;
  size_t longdesc = 5;

  for(i = 0; helptext[i].opt; ++i) {
    size_t len;
    if(!(helptext[i].categories & category))
      continue;
    len = strlen(helptext[i].opt);
    if(len > longopt)
      longopt = len;
    len = strlen(helptext[i].desc);
    if(len > longdesc)
      longdesc = len;
  }
  if(longopt + longdesc > cols)
    longopt = cols - longdesc;

  for(i = 0; helptext[i].opt; ++i)
    if(helptext[i].categories & category) {
      size_t opt = longopt;
      size_t desclen = strlen(helptext[i].desc);
      if(opt + desclen >= (cols - 2)) {
        if(desclen < (cols - 2))
          opt = (cols - 3) - desclen;
        else
          opt = 0;
      }
      printf(" %-*s  %s\n", (int)opt, helptext[i].opt, helptext[i].desc);
    }
}